

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall lzham::symbol_codec::arith_stop_encoding(symbol_codec *this)

{
  uint *puVar1;
  uchar *puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  bVar8 = 0x2000000 < this->m_arith_length;
  uVar7 = 0x8000;
  if (bVar8) {
    uVar7 = 0x800000;
  }
  uVar4 = (uint)bVar8 * 0x800000 + 0x800000;
  puVar1 = &this->m_arith_base;
  uVar5 = *puVar1;
  *puVar1 = *puVar1 + uVar4;
  this->m_arith_length = uVar7;
  if ((CARRY4(uVar5,uVar4)) &&
     (uVar5 = (this->m_arith_output_buf).m_size, uVar6 = (ulong)uVar5, -1 < (int)(uVar5 - 1))) {
    do {
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
      puVar2 = (this->m_arith_output_buf).m_p;
      if (puVar2[uVar6] != 0xff) {
        puVar2[uVar6] = puVar2[uVar6] + '\x01';
        break;
      }
      puVar2[uVar6] = '\0';
    } while (0 < (int)uVar5);
  }
  bVar8 = arith_renorm_enc_interval(this);
  if (bVar8) {
    uVar5 = (this->m_arith_output_buf).m_size;
    bVar8 = true;
    if (uVar5 < 4) {
      do {
        if ((this->m_arith_output_buf).m_capacity <= uVar5) {
          bVar3 = elemental_vector::increase_capacity
                            ((elemental_vector *)&this->m_arith_output_buf,uVar5 + 1,true,1,
                             (object_mover)0x0,true);
          if (!bVar3) goto LAB_0011ec0b;
          uVar5 = (this->m_arith_output_buf).m_size;
        }
        (this->m_arith_output_buf).m_p[uVar5] = '\0';
        uVar5 = (this->m_arith_output_buf).m_size + 1;
        (this->m_arith_output_buf).m_size = uVar5;
        this->m_total_bits_written = this->m_total_bits_written + 8;
      } while (uVar5 < 4);
    }
  }
  else {
LAB_0011ec0b:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool symbol_codec::arith_stop_encoding()
   {
      uint orig_base = m_arith_base;

      if (m_arith_length > 2 * cSymbolCodecArithMinLen)
      {
         m_arith_base  += cSymbolCodecArithMinLen;
         m_arith_length = (cSymbolCodecArithMinLen >> 1);
      }
      else
      {
         m_arith_base  += (cSymbolCodecArithMinLen >> 1);
         m_arith_length = (cSymbolCodecArithMinLen >> 9);
      }

      if (orig_base > m_arith_base)
         arith_propagate_carry();

      if (!arith_renorm_enc_interval())
         return false;

      while (m_arith_output_buf.size() < 4)
      {
         if (!m_arith_output_buf.try_push_back(0))
            return false;
         m_total_bits_written += 8;
      }
      return true;
   }